

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O1

CURLcode Curl_smtp_escape_eob(connectdata *conn,ssize_t nread)

{
  SessionHandle *data;
  void *pvVar1;
  long lVar2;
  long lVar3;
  size_t __n;
  long lVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  char *local_50;
  char *local_40;
  
  data = conn->data;
  pvVar1 = (data->req).protop;
  local_50 = (data->state).scratch;
  if ((local_50 == (char *)0x0) || ((data->set).crlf == true)) {
    local_40 = (char *)(*Curl_cmalloc)(0x8000);
    pcVar6 = local_50;
    local_50 = local_40;
    if (local_40 == (char *)0x0) {
      Curl_failf(data,"Failed to alloc scratch buffer!");
      return CURLE_OUT_OF_MEMORY;
    }
  }
  else {
    local_40 = (char *)0x0;
    pcVar6 = (char *)0x0;
  }
  lVar3 = *(long *)((long)pvVar1 + 0x18);
  lVar5 = -lVar3;
  if (nread < 1) {
    lVar7 = 0;
  }
  else {
    lVar4 = 0;
    lVar7 = 0;
    do {
      lVar2 = *(long *)((long)pvVar1 + 0x18);
      if ("\r\n.\r\n"[lVar2] == (data->req).upload_fromhere[lVar4]) {
        *(long *)((long)pvVar1 + 0x18) = lVar2 + 1;
        if ((lVar2 == 4) || (lVar2 == 1)) {
          *(undefined1 *)((long)pvVar1 + 0x20) = 1;
        }
        else {
          *(undefined1 *)((long)pvVar1 + 0x20) = 0;
        }
      }
      else if (lVar2 != 0) {
        memcpy(local_50 + lVar7,"\r\n.\r\n" + lVar3,lVar2 - lVar3);
        lVar7 = lVar5 + lVar7 + *(long *)((long)pvVar1 + 0x18);
        *(ulong *)((long)pvVar1 + 0x18) = (ulong)((data->req).upload_fromhere[lVar4] == '\r');
        *(undefined1 *)((long)pvVar1 + 0x20) = 0;
        lVar3 = 0;
      }
      if (*(long *)((long)pvVar1 + 0x18) == 0) {
        local_50[lVar7] = (data->req).upload_fromhere[lVar4];
        lVar7 = lVar7 + 1;
      }
      else if (*(long *)((long)pvVar1 + 0x18) == 3) {
        memcpy(local_50 + lVar7,"\r\n.." + lVar3,4U - lVar3);
        lVar7 = lVar7 + (4U - lVar3);
        *(undefined8 *)((long)pvVar1 + 0x18) = 0;
        lVar3 = 0;
      }
      lVar4 = lVar4 + 1;
      lVar5 = -lVar3;
    } while (nread != lVar4);
  }
  __n = *(long *)((long)pvVar1 + 0x18) - lVar3;
  if (__n != 0) {
    memcpy(local_50 + lVar7,"\r\n.\r\n" + lVar3,__n);
    lVar7 = lVar5 + lVar7 + *(long *)((long)pvVar1 + 0x18);
  }
  if (lVar7 == nread) {
    (*Curl_cfree)(local_40);
  }
  else {
    (data->req).upload_fromhere = local_50;
    (data->state).scratch = local_50;
    (*Curl_cfree)(pcVar6);
    (data->req).upload_present = lVar7;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_smtp_escape_eob(struct connectdata *conn, const ssize_t nread)
{
  /* When sending a SMTP payload we must detect CRLF. sequences making sure
     they are sent as CRLF.. instead, as a . on the beginning of a line will
     be deleted by the server when not part of an EOB terminator and a
     genuine CRLF.CRLF which isn't escaped will wrongly be detected as end of
     data by the server
  */
  ssize_t i;
  ssize_t si;
  struct SessionHandle *data = conn->data;
  struct SMTP *smtp = data->req.protop;
  char *scratch = data->state.scratch;
  char *newscratch = NULL;
  char *oldscratch = NULL;
  size_t eob_sent;

  /* Do we need to allocate a scratch buffer? */
  if(!scratch || data->set.crlf) {
    oldscratch = scratch;

    scratch = newscratch = malloc(2 * BUFSIZE);
    if(!newscratch) {
      failf(data, "Failed to alloc scratch buffer!");

      return CURLE_OUT_OF_MEMORY;
    }
  }

  /* Have we already sent part of the EOB? */
  eob_sent = smtp->eob;

  /* This loop can be improved by some kind of Boyer-Moore style of
     approach but that is saved for later... */
  for(i = 0, si = 0; i < nread; i++) {
    if(SMTP_EOB[smtp->eob] == data->req.upload_fromhere[i]) {
      smtp->eob++;

      /* Is the EOB potentially the terminating CRLF? */
      if(2 == smtp->eob || SMTP_EOB_LEN == smtp->eob)
        smtp->trailing_crlf = TRUE;
      else
        smtp->trailing_crlf = FALSE;
    }
    else if(smtp->eob) {
      /* A previous substring matched so output that first */
      memcpy(&scratch[si], &SMTP_EOB[eob_sent], smtp->eob - eob_sent);
      si += smtp->eob - eob_sent;

      /* Then compare the first byte */
      if(SMTP_EOB[0] == data->req.upload_fromhere[i])
        smtp->eob = 1;
      else
        smtp->eob = 0;

      eob_sent = 0;

      /* Reset the trailing CRLF flag as there was more data */
      smtp->trailing_crlf = FALSE;
    }

    /* Do we have a match for CRLF. as per RFC-5321, sect. 4.5.2 */
    if(SMTP_EOB_FIND_LEN == smtp->eob) {
      /* Copy the replacement data to the target buffer */
      memcpy(&scratch[si], &SMTP_EOB_REPL[eob_sent],
             SMTP_EOB_REPL_LEN - eob_sent);
      si += SMTP_EOB_REPL_LEN - eob_sent;
      smtp->eob = 0;
      eob_sent = 0;
    }
    else if(!smtp->eob)
      scratch[si++] = data->req.upload_fromhere[i];
  }

  if(smtp->eob - eob_sent) {
    /* A substring matched before processing ended so output that now */
    memcpy(&scratch[si], &SMTP_EOB[eob_sent], smtp->eob - eob_sent);
    si += smtp->eob - eob_sent;
  }

  /* Only use the new buffer if we replaced something */
  if(si != nread) {
    /* Upload from the new (replaced) buffer instead */
    data->req.upload_fromhere = scratch;

    /* Save the buffer so it can be freed later */
    data->state.scratch = scratch;

    /* Free the old scratch buffer */
    free(oldscratch);

    /* Set the new amount too */
    data->req.upload_present = si;
  }
  else
    free(newscratch);

  return CURLE_OK;
}